

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O2

void __thiscall
uWS::ExtensionsParser::ExtensionsParser(ExtensionsParser *this,char *data,size_t length)

{
  int iVar1;
  char *data_local;
  
  this->serverMaxWindowBits = 0;
  this->clientMaxWindowBits = 0;
  this->lastInteger = (int *)0x0;
  *(undefined4 *)((long)&this->lastInteger + 7) = 0;
  iVar1 = 1;
  data_local = data;
  while ((iVar1 != 0 && (iVar1 != 0x72e))) {
    iVar1 = getToken(this,&data_local,data + length);
  }
  this->perMessageDeflate = iVar1 == 0x72e;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar1 = getToken(this,&data_local,data + length);
            if (iVar1 != 0x92c) break;
            this->clientMaxWindowBits = 1;
            this->lastInteger = &this->clientMaxWindowBits;
          }
          if (iVar1 != 0x944) break;
          this->serverMaxWindowBits = 1;
          this->lastInteger = &this->serverMaxWindowBits;
        }
        if (iVar1 != 0xadf) break;
        this->clientNoContextTakeover = true;
      }
      if (iVar1 != 0xaf7) break;
      this->serverNoContextTakeover = true;
    }
    if ((iVar1 == 0) || (iVar1 == 0x72e)) break;
    if ((iVar1 < 0) && (this->lastInteger != (int *)0x0)) {
      *this->lastInteger = -iVar1;
    }
  }
  return;
}

Assistant:

ExtensionsParser(const char *data, size_t length) {
        const char *stop = data + length;
        int token = 1;
        for (; token && token != TOK_PERMESSAGE_DEFLATE; token = getToken(data, stop));

        perMessageDeflate = (token == TOK_PERMESSAGE_DEFLATE);
        while ((token = getToken(data, stop))) {
            switch (token) {
            case TOK_PERMESSAGE_DEFLATE:
                return;
            case TOK_SERVER_NO_CONTEXT_TAKEOVER:
                serverNoContextTakeover = true;
                break;
            case TOK_CLIENT_NO_CONTEXT_TAKEOVER:
                clientNoContextTakeover = true;
                break;
            case TOK_SERVER_MAX_WINDOW_BITS:
                serverMaxWindowBits = 1;
                lastInteger = &serverMaxWindowBits;
                break;
            case TOK_CLIENT_MAX_WINDOW_BITS:
                clientMaxWindowBits = 1;
                lastInteger = &clientMaxWindowBits;
                break;
            default:
                if (token < 0 && lastInteger) {
                    *lastInteger = -token;
                }
                break;
            }
        }
    }